

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::end_positive_value
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  bool bVar1;
  size_t in_RDX;
  char *in_RSI;
  string_view_type *in_RDI;
  type tVar2;
  type result;
  uint64_t val;
  ser_context *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  semantic_tag tag;
  semantic_tag tag_00;
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  char *local_30;
  to_integer_errc local_28;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  this_00 = (basic_json_parser<char,_std::allocator<char>_> *)&in_RDI[8]._M_str;
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  tVar2 = detail::to_integer_unchecked<unsigned_long,char>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  tag_00 = (semantic_tag)((ulong)in_RSI >> 0x38);
  local_30 = tVar2.ptr;
  local_28 = tVar2.ec;
  bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_30);
  if (bVar1) {
    basic_json_visitor<char>::uint64_value
              ((basic_json_visitor<char> *)this_00,(uint64_t)in_RDI,tag,in_stack_ffffffffffffff88,
               (error_code *)0x1dc9f5);
    *(byte *)((long)&in_RDI[7]._M_str + 3) = (*(byte *)((long)&in_RDI[7]._M_str + 5) ^ 0xff) & 1;
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&in_RDI[8]._M_str);
    basic_json_visitor<char>::string_value
              ((basic_json_visitor<char> *)this_00,in_RDI,tag_00,in_stack_ffffffffffffff88,
               (error_code *)0x1dca4b);
    *(byte *)((long)&in_RDI[7]._M_str + 3) = (*(byte *)((long)&in_RDI[7]._M_str + 5) ^ 0xff) & 1;
  }
  after_value(this_00,(error_code *)in_RDI);
  return;
}

Assistant:

void end_positive_value(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        uint64_t val;
        auto result = jsoncons::detail::to_integer_unchecked(string_buffer_.data(), string_buffer_.length(), val);
        if (result)
        {
            visitor.uint64_value(val, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
        else // Must be overflow
        {
            visitor.string_value(string_buffer_, semantic_tag::bigint, *this, ec);
            more_ = !cursor_mode_;
        }
        after_value(ec);
    }